

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O0

void __thiscall RenX::BanDatabase::process_file_finish(BanDatabase *this,FILE *file)

{
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  ostream *poVar4;
  reference this_00;
  pointer pEVar5;
  ulong __n;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *entry;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
  *__range4;
  FILE *file_local;
  BanDatabase *this_local;
  
  if (this->m_read_version < 3) {
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->m_filename);
    pFVar3 = freopen(pcVar2,"wb",(FILE *)file);
    if (pFVar3 == (FILE *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "FATAL ERROR: UNABLE TO REMOVE UNSUPPORTED BAN DATABASE FILE VERSION"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Warning: Unsupported ban database file version. The database will be removed and rewritten."
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      (**(code **)(*(long *)this + 0x10))(this,file);
      fgetpos((FILE *)file,(fpos_t *)&this->m_eof);
      this->m_read_version = this->m_write_version;
    }
  }
  else {
    __n = (ulong)this->m_write_version;
    if (this->m_read_version < this->m_write_version) {
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&this->m_filename);
      pFVar3 = freopen(pcVar2,"wb",(FILE *)file);
      if (pFVar3 != (FILE *)0x0) {
        (**(code **)(*(long *)this + 0x10))(this,file);
        __end4 = std::
                 vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                 ::begin(&this->m_entries);
        entry = (unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                 *)std::
                   vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                   ::end(&this->m_entries);
        while (bVar1 = __gnu_cxx::
                       operator==<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
                                 (&__end4,(__normal_iterator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
                                           *)&entry), ((bVar1 ^ 0xffU) & 1) != 0) {
          this_00 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
                    ::operator*(&__end4);
          pEVar5 = std::
                   unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                   ::get(this_00);
          write(this,(int)pEVar5,file,__n);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_*,_std::vector<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>_>
          ::operator++(&__end4);
        }
      }
    }
    fgetpos((FILE *)file,(fpos_t *)&this->m_eof);
  }
  return;
}

Assistant:

void RenX::BanDatabase::process_file_finish(FILE *file) {
	if (m_read_version < 3) {
		if (freopen(m_filename.c_str(), "wb", file) == nullptr) {
			std::cout << "FATAL ERROR: UNABLE TO REMOVE UNSUPPORTED BAN DATABASE FILE VERSION" << std::endl;
			return;
		}

		std::cout << "Warning: Unsupported ban database file version. The database will be removed and rewritten." << std::endl;
		create_header(file);
		fgetpos(file, std::addressof(m_eof));
		m_read_version = m_write_version;
		return;
	}
	else if (m_read_version < m_write_version) {
		if (freopen(m_filename.c_str(), "wb", file) != nullptr) {
			this->create_header(file);
			for (const auto& entry : m_entries) {
				write(entry.get(), file);
			}
		}
	}

	fgetpos(file, std::addressof(m_eof));
}